

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O2

bool __thiscall
cmIfFunctionBlocker::ShouldRemove
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *param_2)

{
  bool bVar1;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff,
                          "endif");
  if (bVar1) {
    if ((lff->Arguments).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (lff->Arguments).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    bVar1 = std::operator==(&lff->Arguments,&this->Args);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool cmIfFunctionBlocker::ShouldRemove(const cmListFileFunction& lff,
                                       cmMakefile&)
{
  if (lff.Name.Lower == "endif") {
    // if the endif has arguments, then make sure
    // they match the arguments of the matching if
    if (lff.Arguments.empty() || lff.Arguments == this->Args) {
      return true;
    }
  }

  return false;
}